

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildAndroidMKGenerator.cxx
# Opt level: O0

void __thiscall
cmExportBuildAndroidMKGenerator::GenerateImportTargetCode
          (cmExportBuildAndroidMKGenerator *this,ostream *os,cmGeneratorTarget *target)

{
  undefined8 this_00;
  ostream *poVar1;
  undefined1 auVar2 [16];
  allocator local_d1;
  string local_d0;
  string local_b0;
  undefined1 local_90 [8];
  string path;
  string local_60;
  string local_40 [8];
  string targetName;
  cmGeneratorTarget *target_local;
  ostream *os_local;
  cmExportBuildAndroidMKGenerator *this_local;
  
  targetName.field_2._8_8_ = target;
  std::__cxx11::string::string
            (local_40,(string *)
                      &(this->super_cmExportBuildFileGenerator).super_cmExportFileGenerator.
                       Namespace);
  cmGeneratorTarget::GetExportName_abi_cxx11_
            (&local_60,(cmGeneratorTarget *)targetName.field_2._8_8_);
  std::__cxx11::string::operator+=(local_40,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::operator<<(os,"include $(CLEAR_VARS)\n");
  std::operator<<(os,"LOCAL_MODULE := ");
  poVar1 = std::operator<<(os,local_40);
  std::operator<<(poVar1,"\n");
  std::operator<<(os,"LOCAL_SRC_FILES := ");
  this_00 = targetName.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"",&local_d1);
  cmGeneratorTarget::GetFullPath
            (&local_b0,(cmGeneratorTarget *)this_00,&local_d0,RuntimeBinaryArtifact,false);
  auVar2 = std::__cxx11::string::c_str();
  cmSystemTools::ConvertToOutputPath_abi_cxx11_((string *)local_90,auVar2._0_8_,auVar2._8_8_);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  poVar1 = std::operator<<(os,(string *)local_90);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmExportBuildAndroidMKGenerator::GenerateImportTargetCode(
  std::ostream& os, const cmGeneratorTarget* target)
{
  std::string targetName = this->Namespace;
  targetName += target->GetExportName();
  os << "include $(CLEAR_VARS)\n";
  os << "LOCAL_MODULE := ";
  os << targetName << "\n";
  os << "LOCAL_SRC_FILES := ";
  std::string path =
    cmSystemTools::ConvertToOutputPath(target->GetFullPath().c_str());
  os << path << "\n";
}